

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
          (QMovableArrayOps<QHostAddress> *this,qsizetype i,QHostAddress *args)

{
  QHostAddress **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QHostAddress *pQVar4;
  QHostAddress *pQVar5;
  QHostAddress QVar6;
  QHostAddress *__dest;
  long in_FS_OFFSET;
  bool bVar7;
  QHostAddress tmp;
  Inserter local_60;
  QHostAddress local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_001b1396:
    local_38.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress(&local_38,args);
    bVar7 = (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.size
            != 0;
    QArrayDataPointer<QHostAddress>::detachAndGrow
              ((QArrayDataPointer<QHostAddress> *)this,(uint)(i == 0 && bVar7),1,
               (QHostAddress **)0x0,(QArrayDataPointer<QHostAddress> *)0x0);
    QVar6.d.d.ptr = local_38.d.d.ptr;
    if (i == 0 && bVar7) {
      local_38.d.d.ptr =
           (QExplicitlySharedDataPointer<QHostAddressPrivate>)
           (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
      (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.ptr[-1].d.d
      .ptr = (QHostAddressPrivate *)QVar6.d.d.ptr;
      ppQVar1 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
                size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
               ptr;
      pQVar4 = pQVar5 + i;
      __dest = pQVar4 + 1;
      local_60.nInserts = 1;
      local_60.bytes =
           ((this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.size
           - i) * 8;
      local_60.data = (QArrayDataPointer<QHostAddress> *)this;
      local_60.displaceTo = __dest;
      memmove(__dest,pQVar5 + i,local_60.bytes);
      QVar6.d.d.ptr = local_38.d.d.ptr;
      local_38.d.d.ptr =
           (QExplicitlySharedDataPointer<QHostAddressPrivate>)
           (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
      (pQVar4->d).d.ptr = (QHostAddressPrivate *)QVar6.d.d.ptr;
      local_60.displaceFrom = __dest;
      Inserter::~Inserter(&local_60);
    }
    QHostAddress::~QHostAddress(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.size ==
         i) && (pQVar4 = (this->super_QGenericArrayOps<QHostAddress>).
                         super_QArrayDataPointer<QHostAddress>.ptr,
               (pDVar3->super_QArrayData).alloc !=
               ((long)((long)pQVar4 -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) + i)) {
      QHostAddress::QHostAddress(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QHostAddress>).
                   super_QArrayDataPointer<QHostAddress>.ptr,
         (QHostAddress *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_001b1396;
      QHostAddress::QHostAddress(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }